

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simpletz.cpp
# Opt level: O0

int32_t __thiscall
icu_63::SimpleTimeZone::getOffset
          (SimpleTimeZone *this,uint8_t era,int32_t year,int32_t month,int32_t day,uint8_t dayOfWeek
          ,int32_t millis,UErrorCode *status)

{
  int8_t iVar1;
  uint8_t dayOfWeek_local;
  int32_t day_local;
  int32_t month_local;
  int32_t year_local;
  uint8_t era_local;
  SimpleTimeZone *this_local;
  
  if ((month < 0) || (0xb < month)) {
    *status = U_ILLEGAL_ARGUMENT_ERROR;
    this_local._4_4_ = 0;
  }
  else {
    iVar1 = Grego::monthLength(year,month);
    this_local._4_4_ =
         (*(this->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject[5])
                   (this,(ulong)era,(ulong)(uint)year,(ulong)(uint)month,(ulong)(uint)day,
                    (ulong)dayOfWeek,millis,(int)iVar1,status);
  }
  return this_local._4_4_;
}

Assistant:

int32_t
SimpleTimeZone::getOffset(uint8_t era, int32_t year, int32_t month, int32_t day,
                          uint8_t dayOfWeek, int32_t millis, UErrorCode& status) const
{
    // Check the month before calling Grego::monthLength(). This
    // duplicates the test that occurs in the 7-argument getOffset(),
    // however, this is unavoidable. We don't mind because this method, in
    // fact, should not be called; internal code should always call the
    // 7-argument getOffset(), and outside code should use Calendar.get(int
    // field) with fields ZONE_OFFSET and DST_OFFSET. We can't get rid of
    // this method because it's public API. - liu 8/10/98
    if(month < UCAL_JANUARY || month > UCAL_DECEMBER) {
        status = U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }

    return getOffset(era, year, month, day, dayOfWeek, millis, Grego::monthLength(year, month), status);
}